

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.cpp
# Opt level: O0

void __thiscall Args_ErrorBogusBool_Test::TestBody(Args_ErrorBogusBool_Test *this)

{
  bool bVar1;
  char **__s;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_00000020;
  bool *in_stack_00000028;
  string *in_stack_00000030;
  char ***in_stack_00000038;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  char **argv;
  bool log;
  anon_class_8_1_dd4303e2 callback;
  bool errCalled;
  undefined1 in_stack_fffffffffffffe4f;
  AssertionResult *in_stack_fffffffffffffe50;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffe60;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffe6c;
  int iVar2;
  char *file;
  undefined4 in_stack_fffffffffffffe7c;
  Type type;
  allocator<char> *in_stack_fffffffffffffe80;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string local_168 [24];
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  AssertionResult *in_stack_fffffffffffffec8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed0;
  string local_128 [48];
  AssertionResult local_f8;
  string local_e8 [24];
  string *in_stack_ffffffffffffff30;
  char local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  AssertionResult local_70 [2];
  undefined1 local_49 [33];
  char **local_28;
  undefined1 local_19;
  undefined1 *local_18;
  undefined1 local_9 [9];
  
  local_9[0] = 0;
  local_18 = local_9;
  local_19 = 0;
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  __s = makeArgs(in_stack_ffffffffffffff30);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  __a = &local_91;
  local_28 = __s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
  file = local_b8;
  std::function<void(std::__cxx11::string)>::
  function<Args_ErrorBogusBool_Test::TestBody()::__0&,void>
            (in_stack_fffffffffffffe60,
             (anon_class_8_1_dd4303e2 *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  bVar1 = pbrt::ParseArg<bool*>
                    (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe7c);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x58eeee);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  iVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe6c);
  if (!bVar1) {
    testing::Message::Message((Message *)__a);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,file,iVar2,(char *)in_stack_fffffffffffffe60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffed0.ptr_,(Message *)in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_e8);
    testing::Message::~Message((Message *)0x58f08e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58f106);
  this_01 = &local_f8;
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  iVar2 = CONCAT13((char)((uint)iVar2 >> 0x18),CONCAT12(bVar1,(short)iVar2));
  if (!bVar1) {
    testing::Message::Message((Message *)__a);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,file,iVar2,&this_01->success_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffed0.ptr_,(Message *)in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_128);
    testing::Message::~Message((Message *)0x58f21a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58f292);
  this_00 = (AssertionResult *)&stack0xfffffffffffffec8;
  testing::AssertionResult::AssertionResult(this_00,(bool)in_stack_fffffffffffffe4f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)__a);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,file,iVar2,&this_01->success_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffed0.ptr_,(Message *)in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_168);
    testing::Message::~Message((Message *)0x58f387);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58f3f6);
  return;
}

Assistant:

TEST(Args, ErrorBogusBool) {
    bool errCalled = false;
    auto callback = [&errCalled](const std::string &s) { errCalled = true; };

    bool log = false;
    auto argv = makeArgs("--log=tru3");
    EXPECT_FALSE(ParseArg(&argv, "log", &log, callback));
    EXPECT_FALSE(log);
    EXPECT_TRUE(errCalled);
}